

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

bool kj::anon_unknown_31::FastCaseCmp<'n',_'k',_'e',_'d'>::apply(char *actual)

{
  bool local_11;
  char *actual_local;
  
  local_11 = false;
  if ((byte)(*actual | 0x20U) == 0x6e) {
    local_11 = FastCaseCmp<'k',_'e',_'d'>::apply(actual + 1);
  }
  return local_11;
}

Assistant:

static constexpr bool apply(const char* actual) {
    return
      'a' <= first && first <= 'z'
        ? (*actual | 0x20) == first && FastCaseCmp<rest...>::apply(actual + 1)
      : 'A' <= first && first <= 'Z'
        ? (*actual & ~0x20) == first && FastCaseCmp<rest...>::apply(actual + 1)
        : *actual == first && FastCaseCmp<rest...>::apply(actual + 1);
  }